

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O3

void Abc_AigCheckFaninOrder(Abc_Aig_t *pMan)

{
  int *piVar1;
  void **ppvVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  long lVar5;
  
  iVar3 = pMan->nBins;
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      pAVar4 = pMan->pBins[lVar5];
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        do {
          piVar1 = (pAVar4->vFanins).pArray;
          ppvVar2 = pAVar4->pNtk->vObjs->pArray;
          if (*(int *)(((ulong)ppvVar2[piVar1[1]] & 0xfffffffffffffffe) + 0x10) <
              *(int *)(((ulong)ppvVar2[*piVar1] & 0xfffffffffffffffe) + 0x10)) {
            printf("Node %d has incorrect ordering of fanins.\n",(ulong)(uint)pAVar4->Id);
          }
          pAVar4 = pAVar4->pNext;
        } while (pAVar4 != (Abc_Obj_t *)0x0);
        iVar3 = pMan->nBins;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  return;
}

Assistant:

void Abc_AigCheckFaninOrder( Abc_Aig_t * pMan )
{
    Abc_Obj_t * pEnt;
    int i;
    for ( i = 0; i < pMan->nBins; i++ )
        Abc_AigBinForEachEntry( pMan->pBins[i], pEnt )
        {
            if ( Abc_ObjRegular(Abc_ObjChild0(pEnt))->Id > Abc_ObjRegular(Abc_ObjChild1(pEnt))->Id )
            {
//                int i0 = Abc_ObjRegular(Abc_ObjChild0(pEnt))->Id;
//                int i1 = Abc_ObjRegular(Abc_ObjChild1(pEnt))->Id;
                printf( "Node %d has incorrect ordering of fanins.\n", pEnt->Id );
            }
        }
}